

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::Clear(ImageFeatureType_ImageSizeRange *this)

{
  if (this->widthrange_ != (SizeRange *)0x0) {
    (*(this->widthrange_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->widthrange_ = (SizeRange *)0x0;
  if (this->heightrange_ != (SizeRange *)0x0) {
    (*(this->heightrange_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->heightrange_ = (SizeRange *)0x0;
  return;
}

Assistant:

void ImageFeatureType_ImageSizeRange::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ImageFeatureType.ImageSizeRange)
  if (GetArenaNoVirtual() == NULL && widthrange_ != NULL) {
    delete widthrange_;
  }
  widthrange_ = NULL;
  if (GetArenaNoVirtual() == NULL && heightrange_ != NULL) {
    delete heightrange_;
  }
  heightrange_ = NULL;
}